

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

shared_ptr<helics::MessageFederate> getMessageFedSharedPtr(HelicsFederate fed,HelicsError *err)

{
  char *pcVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  HelicsError *pHVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  shared_ptr<helics::MessageFederate> sVar7;
  
  if ((in_RDX == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     (*(int *)&in_RDX->_vptr__Sp_counted_base == 0)) {
    if (err == (HelicsError *)0x0) {
      if (in_RDX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0019ffc9;
      goto LAB_0019ffdb;
    }
    bVar5 = *(int *)&err->message != 0x2352188;
    pHVar4 = (HelicsError *)0x0;
    if (!bVar5) {
      pHVar4 = err;
    }
    if (bVar5 && in_RDX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0019ffc9:
      *(undefined4 *)&in_RDX->_vptr__Sp_counted_base = 0xfffffffd;
      *(char **)&in_RDX->_M_use_count = "federate object is not valid";
      goto LAB_0019ffdb;
    }
  }
  else {
LAB_0019ffdb:
    pHVar4 = (HelicsError *)0x0;
  }
  _Var3._M_pi = in_RDX;
  if (pHVar4 != (HelicsError *)0x0) {
    if (pHVar4->error_code - 2U < 3) {
      if (*(long *)(pHVar4 + 1) == 0) {
        lVar2 = 0;
      }
      else {
        auVar6 = __dynamic_cast(*(long *)(pHVar4 + 1),&helics::Federate::typeinfo,
                                &helics::MessageFederate::typeinfo,0xffffffffffffffff);
        lVar2 = auVar6._0_8_;
        _Var3._M_pi = auVar6._8_8_;
      }
      if (lVar2 == 0) {
        *(undefined8 *)fed = 0;
        *(undefined8 *)((long)fed + 8) = 0;
      }
      else {
        *(long *)fed = lVar2;
        pcVar1 = pHVar4[1].message;
        *(char **)((long)fed + 8) = pcVar1;
        if (pcVar1 != (char *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(pcVar1 + 8) = *(int *)(pcVar1 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(pcVar1 + 8) = *(int *)(pcVar1 + 8) + 1;
          }
        }
      }
      if (*fed != 0) goto LAB_001a007c;
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)fed + 8) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)fed + 8));
        _Var3._M_pi = extraout_RDX;
      }
    }
    if (in_RDX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      *(undefined4 *)&in_RDX->_vptr__Sp_counted_base = 0xfffffffd;
      *(char **)&in_RDX->_M_use_count = "Federate must be a message federate";
    }
  }
  *(undefined8 *)fed = 0;
  *(undefined8 *)((long)fed + 8) = 0;
LAB_001a007c:
  sVar7.super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar7.super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fed;
  return (shared_ptr<helics::MessageFederate>)
         sVar7.super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helics::MessageFederate> getMessageFedSharedPtr(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if ((fedObj->type == helics::FederateType::MESSAGE) || (fedObj->type == helics::FederateType::COMBINATION) ||
        (fedObj->type == helics::FederateType::CALLBACK)) {
        auto rval = std::dynamic_pointer_cast<helics::MessageFederate>(fedObj->fedptr);
        if (rval) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notMessageFedString);
    return nullptr;
}